

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.cpp
# Opt level: O1

bool gpu::buildShaders(void)

{
  GLuint GVar1;
  GLuint GVar2;
  GLint GVar3;
  GLuint GVar4;
  int skinning_1;
  ShaderData *data;
  u32 uVar5;
  int skinning;
  long lVar6;
  char *errs;
  u32 vertShader [2];
  u8 *local_d0;
  GLuint aGStack_c8 [2];
  Span<char> local_c0;
  Span<char> local_b0;
  Span<char> local_a0;
  Span<char> local_90;
  Span<char> local_80;
  Span<char> local_70;
  Span<char> local_60;
  Span<char> local_50;
  Span<char> local_40;
  
  lVar6 = 0;
  do {
    GVar1 = (*glad_debug_glCreateShader)(0x8b31);
    aGStack_c8[lVar6] = GVar1;
    if (lVar6 == 0) {
      uploadShaderSources<char_const*,char_const*>(GVar1,&src::version,&src::basicVertShader);
    }
    else {
      snprintf((char *)scratch._data,scratch._size,
               "\nuniform mat3 u_modelMat3;\nuniform mat4 u_modelViewProj;\nuniform vec4 u_color;\n#define MAX_BONES %d\nuniform mat4 u_jointMatrices[MAX_BONES];\n\nlayout(location = 0) in vec3 a_pos;\nlayout(location = 1) in vec3 a_normal;\nlayout(location = 2) in vec3 a_tangent;\nlayout(location = 3) in vec3 a_bitangent;\nlayout(location = 4) in vec2 a_texCoord0;\nlayout(location = 5) in vec2 a_texCoord1;\nlayout(location = 6) in vec4 a_color;\nlayout(location = 7) in uvec4 a_jointInds;\nlayout(location = 8) in vec4 a_jointWeights;\n\nout vec3 v_normal;\nout vec3 v_tangent;\nout vec3 v_bitangent;\nout vec2 v_texCoord0;\nout vec2 v_texCoord1;\nout vec4 v_color;\n\nvoid main()\n{\n    mat4 skinMtx =\n        a_jointWeights[0] * u_jointMatrices[a_jointInds[0]] +\n        a_jointWeights[1] * u_jointMatrices[a_jointInds[1]] +\n        a_jointWeights[2] * u_jointMatrices[a_jointInds[2]] +\n        a_jointWeights[3] * u_jointMatrices[a_jointInds[3]];\n    gl_Position = u_modelViewProj * skinMtx * vec4(a_pos, 1.0);\n    mat3 modelSkin3 = u_modelMat3 * mat3(skinMtx);\n    v_normal = modelSkin3 * a_normal;\n    v_tangent = modelSkin3 * a_tangent;\n    v_bitangent = modelSkin3 * a_bitangent;\n    v_texCoord0 = a_texCoord0;\n    v_texCoord1 = a_texCoord1;\n    v_color = u_color * a_color;\n}\n\n"
               ,0x40);
      local_d0 = scratch._data;
      uploadShaderSources<char_const*,char*>(GVar1,&src::version,(char **)&local_d0);
    }
    (*glad_debug_glCompileShader)(GVar1);
    local_a0._data = infoLog;
    local_a0._size = 0x8000;
    local_d0 = (u8 *)tg::getShaderCompileErrors(GVar1,&local_a0);
    if (local_d0 != (u8 *)0x0) goto LAB_0011d1ff;
    lVar6 = lVar6 + 1;
    local_d0 = (u8 *)0x0;
  } while (lVar6 == 1);
  data = (ShaderData *)&sd::pbrMetallic;
  lVar6 = 0;
  local_d0 = (u8 *)0x0;
  do {
    GVar1 = (*glad_debug_glCreateShader)(0x8b30);
    uploadShaderSources<char_const*,char_const*>(GVar1,&src::version,&src::pbrMetallic);
    (*glad_debug_glCompileShader)(GVar1);
    local_b0._data = infoLog;
    local_b0._size = 0x8000;
    local_d0 = (u8 *)tg::getShaderCompileErrors(GVar1,&local_b0);
    if (local_d0 != (u8 *)0x0) goto LAB_0011d1ff;
    GVar2 = (*glad_debug_glCreateProgram)();
    data->prog = GVar2;
    GVar4 = aGStack_c8[lVar6];
    (*glad_debug_glAttachShader)(GVar2,GVar4);
    (*glad_debug_glAttachShader)(data->prog,GVar1);
    (*glad_debug_glLinkProgram)(data->prog);
    local_c0._data = infoLog;
    local_c0._size = 0x8000;
    local_d0 = (u8 *)tg::getShaderLinkErrors(data->prog,&local_c0);
    if (local_d0 != (u8 *)0x0) {
      tl::printError<char_const*>((char **)&local_d0);
      (*glad_debug_glDeleteShader)(GVar1);
      uVar5 = data->prog;
      goto LAB_0011d236;
    }
    findAllUnifLocations(data);
    if (lVar6 == 0) {
      GVar3 = -1;
    }
    else {
      GVar3 = (*glad_debug_glGetUniformLocation)(data->prog,"u_jointMatrices");
    }
    (data->unifLocs).jointMatrices = GVar3;
    (*glad_debug_glDetachShader)(data->prog,GVar4);
    (*glad_debug_glDetachShader)(data->prog,GVar1);
    (*glad_debug_glDeleteShader)(GVar1);
    (*glad_debug_glUseProgram)(data->prog);
    (*glad_debug_glUniform1i)((data->unifLocs).colorTexture,0);
    (*glad_debug_glUniform1i)((data->unifLocs).normalTexture,1);
    lVar6 = lVar6 + 1;
    data = data + 1;
  } while (lVar6 == 1);
  GVar1 = (*glad_debug_glCreateShader)(0x8b31);
  uploadShaderSources<char_const*,char_const*>(GVar1,&src::version,&src::vertColor_vert);
  (*glad_debug_glCompileShader)(GVar1);
  local_40._data = infoLog;
  local_40._size = 0x8000;
  local_d0 = (u8 *)tg::getShaderCompileErrors(GVar1,&local_40);
  if (local_d0 == (u8 *)0x0) {
    GVar4 = (*glad_debug_glCreateShader)(0x8b30);
    uploadShaderSources<char_const*,char_const*>(GVar4,&src::version,&src::vertColor_frag);
    (*glad_debug_glCompileShader)(GVar4);
    local_50._data = infoLog;
    local_50._size = 0x8000;
    local_d0 = (u8 *)tg::getShaderCompileErrors(GVar4,&local_50);
    if (local_d0 == (u8 *)0x0) {
      sd::vertColor = (*glad_debug_glCreateProgram)();
      (*glad_debug_glAttachShader)(sd::vertColor,GVar1);
      (*glad_debug_glAttachShader)(sd::vertColor,GVar4);
      (*glad_debug_glLinkProgram)(sd::vertColor);
      local_60._data = infoLog;
      local_60._size = 0x8000;
      local_d0 = (u8 *)tg::getShaderLinkErrors(sd::vertColor,&local_60);
      if (local_d0 != (u8 *)0x0) {
        tl::printError<char_const*>((char **)&local_d0);
        (*glad_debug_glDeleteShader)(GVar1);
        (*glad_debug_glDeleteShader)(GVar4);
        uVar5 = sd::vertColor;
LAB_0011d236:
        (*glad_debug_glDeleteProgram)(uVar5);
        return false;
      }
      (*glad_debug_glDetachShader)(sd::vertColor,GVar1);
      (*glad_debug_glDetachShader)(sd::vertColor,GVar4);
      (*glad_debug_glDeleteShader)(GVar1);
      (*glad_debug_glDeleteShader)(GVar4);
      _DAT_004045dc = (*glad_debug_glGetUniformLocation)(sd::vertColor,"u_modelViewProj");
      GVar1 = (*glad_debug_glCreateShader)(0x8b31);
      uploadShaderSources<char_const*,char_const*>(GVar1,&src::version,&src::onlyPos_vert);
      (*glad_debug_glCompileShader)(GVar1);
      local_70._data = infoLog;
      local_70._size = 0x8000;
      local_d0 = (u8 *)tg::getShaderCompileErrors(GVar1,&local_70);
      if (local_d0 == (u8 *)0x0) {
        GVar4 = (*glad_debug_glCreateShader)(0x8b30);
        uploadShaderSources<char_const*,char_const*>(GVar4,&src::version,&src::floorGrid_frag);
        (*glad_debug_glCompileShader)(GVar4);
        local_80._data = infoLog;
        local_80._size = 0x8000;
        local_d0 = (u8 *)tg::getShaderCompileErrors(GVar4,&local_80);
        if (local_d0 == (u8 *)0x0) {
          sd::floorGrid = (*glad_debug_glCreateProgram)();
          (*glad_debug_glAttachShader)(sd::floorGrid,GVar1);
          (*glad_debug_glAttachShader)(sd::floorGrid,GVar4);
          (*glad_debug_glLinkProgram)(sd::floorGrid);
          local_90._data = infoLog;
          local_90._size = 0x8000;
          local_d0 = (u8 *)tg::getShaderLinkErrors(sd::floorGrid,&local_90);
          if (local_d0 == (u8 *)0x0) {
            (*glad_debug_glDetachShader)(sd::floorGrid,GVar1);
            (*glad_debug_glDetachShader)(sd::floorGrid,GVar4);
            (*glad_debug_glDeleteShader)(GVar1);
            (*glad_debug_glDeleteShader)(GVar4);
            _DAT_004045e4 = (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_modelView");
            _DAT_004045e8 = (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_modelViewProj");
            _DAT_004045ec = (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_color");
            _DAT_004045f0 = (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_distToFloor");
            lVar6 = 0;
            do {
              (*glad_debug_glDeleteShader)(aGStack_c8[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar6 == 1);
            return true;
          }
          tl::printError<char_const*>((char **)&local_d0);
          (*glad_debug_glDeleteShader)(GVar1);
          (*glad_debug_glDeleteShader)(GVar4);
          uVar5 = sd::floorGrid;
          goto LAB_0011d236;
        }
      }
    }
  }
LAB_0011d1ff:
  tl::printError<char_const*>((char **)&local_d0);
  return false;
}

Assistant:

bool buildShaders()
{
    u32 vertShader[2];
    for(int skinning = 0; skinning < 2; skinning++) {
        vertShader[skinning] = glCreateShader(GL_VERTEX_SHADER);
        if(skinning) {
            snprintf(scratchStr().begin(), scratchStr().size(), src::skinningVertShader, MAX_NUM_JOINTS);
            uploadShaderSources(vertShader[skinning], src::version, scratchStr().begin());
        }
        else {
            uploadShaderSources(vertShader[skinning], src::version, src::basicVertShader);
        }
        glCompileShader(vertShader[skinning]);
        if(const char* errs = tg::getShaderCompileErrors(vertShader[skinning], infoLog)) {
            tl::printError(errs);
            return false;
        }
    }

    // metallic
    for(int skinning = 0; skinning < 2; skinning++) {
        const u32 fragShader = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShader, src::version, src::pbrMetallic);
        glCompileShader(fragShader);
        if(const char* errs = tg::getShaderCompileErrors(fragShader, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::pbrMetallic[skinning];
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShader[skinning]);
        glAttachShader(data.prog, fragShader);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(fragShader);
            glDeleteProgram(data.prog);
            return false;
        }
        findAllUnifLocations(data);
        data.unifLocs.jointMatrices = skinning ? glGetUniformLocation(data.prog, "u_jointMatrices") : -1;
        glDetachShader(data.prog, vertShader[skinning]);
        glDetachShader(data.prog, fragShader);
        glDeleteShader(fragShader);
        glUseProgram(data.prog);
        glUniform1i(data.unifLocs.colorTexture, int(ETexUnit::ALBEDO));
        glUniform1i(data.unifLocs.normalTexture, int(ETexUnit::NORMAL));
    }

    { // shader vert color
        const u32 vertShad = glCreateShader(GL_VERTEX_SHADER);
        uploadShaderSources(vertShad, src::version, src::vertColor_vert);
        glCompileShader(vertShad);
        if(const char* errs = tg::getShaderCompileErrors(vertShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        const u32 fragShad = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShad, src::version, src::vertColor_frag);
        glCompileShader(fragShad);
        if(const char* errs = tg::getShaderCompileErrors(fragShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::vertColor;
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShad);
        glAttachShader(data.prog, fragShad);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(vertShad);
            glDeleteShader(fragShad);
            glDeleteProgram(data.prog);
            return false;
        }
        glDetachShader(data.prog, vertShad);
        glDetachShader(data.prog, fragShad);
        glDeleteShader(vertShad);
        glDeleteShader(fragShad);

        data.locs.modelViewProj = glGetUniformLocation(data.prog, "u_modelViewProj");
    }

    { // shader floor grid
        const u32 vertShad = glCreateShader(GL_VERTEX_SHADER);
        uploadShaderSources(vertShad, src::version, src::onlyPos_vert);
        glCompileShader(vertShad);
        if(const char* errs = tg::getShaderCompileErrors(vertShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        const u32 fragShad = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShad, src::version, src::floorGrid_frag);
        glCompileShader(fragShad);
        if(const char* errs = tg::getShaderCompileErrors(fragShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::floorGrid;
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShad);
        glAttachShader(data.prog, fragShad);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(vertShad);
            glDeleteShader(fragShad);
            glDeleteProgram(data.prog);
            return false;
        }
        glDetachShader(data.prog, vertShad);
        glDetachShader(data.prog, fragShad);
        glDeleteShader(vertShad);
        glDeleteShader(fragShad);

        data.locs.modelView = glGetUniformLocation(data.prog, "u_modelView");
        data.locs.modelViewProj = glGetUniformLocation(data.prog, "u_modelViewProj");
        data.locs.color = glGetUniformLocation(data.prog, "u_color");
        data.locs.distToFloor = glGetUniformLocation(data.prog, "u_distToFloor");
    }

    for(int skinning = 0; skinning < 2; skinning++)
        glDeleteShader(vertShader[skinning]);
    return true;
}